

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_add_lm_file(ps_decoder_t *ps,char *name,char *path)

{
  int iVar1;
  ngram_model_t *lm;
  
  lm = ngram_model_read(ps->config,path,NGRAM_AUTO,ps->lmath);
  if (lm == (ngram_model_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = ps_add_lm(ps,name,lm);
    ngram_model_free(lm);
  }
  return iVar1;
}

Assistant:

int
ps_add_lm_file(ps_decoder_t *ps, const char *name, const char *path)
{
  ngram_model_t *lm;
  int result;

  lm = ngram_model_read(ps->config, path, NGRAM_AUTO, ps->lmath);
  if (!lm)
      return -1;

  result = ps_add_lm(ps, name, lm);
  ngram_model_free(lm);
  return result;
}